

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall
QStyleSheetStyle::renderMenuItemIcon
          (QStyleSheetStyle *this,QStyleOptionMenuItem *mi,QPainter *p,QWidget *w,QRect *rect,
          QRenderRule *subRule)

{
  QSharedDataPointer<QStyleSheetGeometryData> *this_00;
  int iVar1;
  int iVar2;
  QStyleSheetGeometryData *ptr;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QRect QVar10;
  QRenderRule iconRule;
  QRect local_108;
  QSize local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined4 local_d8;
  undefined4 local_d4;
  double local_d0;
  double local_c8;
  QRenderRule local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,mi,w);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d4 = local_d8;
  QPainter::device();
  dVar5 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(&local_f8,dVar5,(int)mi + 0x78,(State)&local_d8);
  iVar1 = QPixmap::width();
  uVar6 = QPixmap::devicePixelRatio();
  iVar2 = QPixmap::height();
  uVar7 = QPixmap::devicePixelRatio();
  auVar8._0_8_ = (double)iVar1;
  auVar8._8_8_ = (double)iVar2;
  auVar9._8_8_ = uVar7;
  auVar9._0_8_ = uVar6;
  auVar8 = divpd(auVar8,auVar9);
  iVar1 = (int)auVar8._0_8_;
  iVar2 = (int)auVar8._8_8_;
  memset(&local_c0,0xaa,0x88);
  renderRule(&local_c0,this,&w->super_QObject,&mi->super_QStyleOption,0x27);
  this_00 = &local_c0.geo;
  if (local_c0.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
    ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
    (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    ptr->minWidth = iVar1;
    ptr->minHeight = iVar2;
    ptr->width = iVar1;
    ptr->height = iVar2;
    ptr->maxWidth = -1;
    ptr->maxHeight = -1;
    QSharedDataPointer<QStyleSheetGeometryData>::reset(this_00,ptr);
  }
  else {
    if (*(int *)local_c0.geo.d.ptr != 1) {
      QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(this_00);
    }
    *(int *)((long)local_c0.geo.d.ptr + 0xc) = iVar1;
    if (*(int *)local_c0.geo.d.ptr != 1) {
      QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(this_00);
    }
    ((QStyleSheetGeometryData *)local_c0.geo.d.ptr)->height = iVar2;
  }
  QVar10 = positionRect(this,w,subRule,&local_c0,0x27,rect,(mi->super_QStyleOption).direction);
  local_108 = QVar10;
  QRenderRule::drawRule(&local_c0,p,&local_108);
  lVar4 = (long)QVar10.x2.m_i.m_i + (long)QVar10.x1.m_i.m_i;
  lVar3 = (QVar10._8_8_ >> 0x20) + (QVar10._0_8_ >> 0x20);
  local_d0 = (double)((int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1) -
                     ((iVar1 - (iVar1 + -1 >> 0x1f)) + -1 >> 1));
  local_c8 = (double)((int)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 1) -
                     ((iVar2 - (iVar2 + -1 >> 0x1f)) + -1 >> 1));
  QPainter::drawPixmap((QPointF *)p,(QPixmap *)&local_d0);
  QRenderRule::~QRenderRule(&local_c0);
  QPixmap::~QPixmap((QPixmap *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::renderMenuItemIcon(const QStyleOptionMenuItem *mi, QPainter *p, const QWidget *w,
                                          const QRect &rect, QRenderRule &subRule) const
{
    const QIcon::Mode mode = mi->state & QStyle::State_Enabled
                           ? (mi->state & QStyle::State_Selected ? QIcon::Active : QIcon::Normal)
                           : QIcon::Disabled;
    const bool checked = mi->checkType != QStyleOptionMenuItem::NotCheckable && mi->checked;
    const auto iconSize = pixelMetric(PM_SmallIconSize, mi, w);
    const QSize sz(iconSize, iconSize);
    const QPixmap pixmap(mi->icon.pixmap(sz, QStyleHelper::getDpr(p), mode,
                        checked ? QIcon::On : QIcon::Off));
    const int pixw = pixmap.width() / pixmap.devicePixelRatio();
    const int pixh = pixmap.height() / pixmap.devicePixelRatio();
    QRenderRule iconRule = renderRule(w, mi, PseudoElement_MenuIcon);
    if (!iconRule.hasGeometry()) {
        iconRule.geo = new QStyleSheetGeometryData(pixw, pixh, pixw, pixh, -1, -1);
    } else {
        iconRule.geo->width = pixw;
        iconRule.geo->height = pixh;
    }
    QRect iconRect = positionRect(w, subRule, iconRule, PseudoElement_MenuIcon, rect, mi->direction);
    if (mi->direction == Qt::LeftToRight)
        iconRect.moveLeft(iconRect.left());
    else
        iconRect.moveRight(iconRect.right());
    iconRule.drawRule(p, iconRect);
    QRect pmr(0, 0, pixw, pixh);
    pmr.moveCenter(iconRect.center());
    p->drawPixmap(pmr.topLeft(), pixmap);
}